

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  Scene *pSVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  float fVar38;
  float fVar40;
  float fVar41;
  undefined1 auVar39 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint uVar55;
  uint uVar56;
  uint uVar57;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong local_15d0;
  ulong local_1560;
  RTCFilterFunctionNArguments local_1550;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13d0 [16];
  float local_13c0 [4];
  undefined1 local_13b0 [16];
  float local_13a0 [4];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined4 local_1300;
  undefined4 uStack_12fc;
  undefined4 uStack_12f8;
  undefined4 uStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar71 = ZEXT3264(CONCAT428(fVar38,CONCAT424(fVar38,CONCAT420(fVar38,CONCAT416(fVar38,CONCAT412(
                                                  fVar38,CONCAT48(fVar38,CONCAT44(fVar38,fVar38)))))
                                               )));
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1460._4_4_ = fVar40;
  local_1460._0_4_ = fVar40;
  local_1460._8_4_ = fVar40;
  local_1460._12_4_ = fVar40;
  local_1460._16_4_ = fVar40;
  local_1460._20_4_ = fVar40;
  local_1460._24_4_ = fVar40;
  local_1460._28_4_ = fVar40;
  auVar44 = ZEXT3264(local_1460);
  fVar41 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1480._4_4_ = fVar41;
  local_1480._0_4_ = fVar41;
  local_1480._8_4_ = fVar41;
  local_1480._12_4_ = fVar41;
  local_1480._16_4_ = fVar41;
  local_1480._20_4_ = fVar41;
  local_1480._24_4_ = fVar41;
  local_1480._28_4_ = fVar41;
  auVar47 = ZEXT3264(local_1480);
  fVar38 = fVar38 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar40 = fVar40 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar41 = fVar41 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_14a0._0_8_ = CONCAT44(fVar38,fVar38) ^ 0x8000000080000000;
  local_14a0._8_4_ = -fVar38;
  local_14a0._12_4_ = -fVar38;
  local_14a0._16_4_ = -fVar38;
  local_14a0._20_4_ = -fVar38;
  local_14a0._24_4_ = -fVar38;
  local_14a0._28_4_ = -fVar38;
  auVar49 = ZEXT3264(local_14a0);
  local_14c0._0_8_ = CONCAT44(fVar40,fVar40) ^ 0x8000000080000000;
  local_14c0._8_4_ = -fVar40;
  local_14c0._12_4_ = -fVar40;
  local_14c0._16_4_ = -fVar40;
  local_14c0._20_4_ = -fVar40;
  local_14c0._24_4_ = -fVar40;
  local_14c0._28_4_ = -fVar40;
  auVar50 = ZEXT3264(local_14c0);
  local_14e0._0_8_ = CONCAT44(fVar41,fVar41) ^ 0x8000000080000000;
  local_14e0._8_4_ = -fVar41;
  local_14e0._12_4_ = -fVar41;
  local_14e0._16_4_ = -fVar41;
  local_14e0._20_4_ = -fVar41;
  local_14e0._24_4_ = -fVar41;
  local_14e0._28_4_ = -fVar41;
  auVar54 = ZEXT3264(local_14e0);
  iVar16 = (tray->tnear).field_0.i[k];
  local_1500._4_4_ = iVar16;
  local_1500._0_4_ = iVar16;
  local_1500._8_4_ = iVar16;
  local_1500._12_4_ = iVar16;
  local_1500._16_4_ = iVar16;
  local_1500._20_4_ = iVar16;
  local_1500._24_4_ = iVar16;
  local_1500._28_4_ = iVar16;
  auVar59 = ZEXT3264(local_1500);
  iVar16 = (tray->tfar).field_0.i[k];
  local_1520._4_4_ = iVar16;
  local_1520._0_4_ = iVar16;
  local_1520._8_4_ = iVar16;
  local_1520._12_4_ = iVar16;
  local_1520._16_4_ = iVar16;
  local_1520._20_4_ = iVar16;
  local_1520._24_4_ = iVar16;
  local_1520._28_4_ = iVar16;
  auVar62 = ZEXT3264(local_1520);
  iVar16 = 1 << ((uint)k & 0x1f);
  auVar33._4_4_ = iVar16;
  auVar33._0_4_ = iVar16;
  auVar33._8_4_ = iVar16;
  auVar33._12_4_ = iVar16;
  auVar33._16_4_ = iVar16;
  auVar33._20_4_ = iVar16;
  auVar33._24_4_ = iVar16;
  auVar33._28_4_ = iVar16;
  auVar6 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar33 = vpand_avx2(auVar33,auVar6);
  local_1340 = vpcmpeqd_avx2(auVar33,auVar6);
  puVar22 = local_11f8;
  do {
    puVar21 = puVar22;
    if (puVar21 == &local_1200) break;
    puVar22 = puVar21 + -1;
    uVar26 = puVar21[-1];
    do {
      if ((uVar26 & 8) == 0) {
        uVar19 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar34._4_4_ = uVar19;
        auVar34._0_4_ = uVar19;
        auVar34._8_4_ = uVar19;
        auVar34._12_4_ = uVar19;
        auVar34._16_4_ = uVar19;
        auVar34._20_4_ = uVar19;
        auVar34._24_4_ = uVar19;
        auVar34._28_4_ = uVar19;
        uVar17 = uVar26 & 0xfffffffffffffff0;
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + uVar23),auVar34,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + uVar23));
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + uVar24),auVar34,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + uVar24));
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar30),auVar71._0_32_,auVar49._0_32_);
        auVar31 = vfmadd213ps_fma(ZEXT1632(auVar31),auVar44._0_32_,auVar50._0_32_);
        auVar33 = vpmaxsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar31));
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + uVar25),auVar34,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + uVar25));
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar30),auVar47._0_32_,auVar54._0_32_);
        auVar6 = vpmaxsd_avx2(ZEXT1632(auVar30),auVar59._0_32_);
        auVar33 = vpmaxsd_avx2(auVar33,auVar6);
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + (uVar23 ^ 0x20)),auVar34,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + (uVar23 ^ 0x20)));
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar30),auVar71._0_32_,auVar49._0_32_);
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + (uVar24 ^ 0x20)),auVar34,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + (uVar24 ^ 0x20)));
        auVar31 = vfmadd213ps_fma(ZEXT1632(auVar31),auVar44._0_32_,auVar50._0_32_);
        auVar39 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + (uVar25 ^ 0x20)),auVar34,
                                  *(undefined1 (*) [32])(uVar17 + 0x40 + (uVar25 ^ 0x20)));
        auVar6 = vpminsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar31));
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar39),auVar47._0_32_,auVar54._0_32_);
        auVar5 = vpminsd_avx2(ZEXT1632(auVar30),auVar62._0_32_);
        auVar6 = vpminsd_avx2(auVar6,auVar5);
        auVar33 = vcmpps_avx(auVar33,auVar6,2);
        if (((uint)uVar26 & 7) == 6) {
          auVar6 = vcmpps_avx(*(undefined1 (*) [32])(uVar17 + 0x1c0),auVar34,2);
          auVar5 = vcmpps_avx(auVar34,*(undefined1 (*) [32])(uVar17 + 0x1e0),1);
          auVar6 = vandps_avx(auVar6,auVar5);
          auVar33 = vandps_avx(auVar6,auVar33);
          auVar30 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
        }
        else {
          auVar30 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
        }
        auVar30 = vpsllw_avx(auVar30,0xf);
        auVar30 = vpacksswb_avx(auVar30,auVar30);
        local_1560 = (ulong)(byte)(SUB161(auVar30 >> 7,0) & 1 | (SUB161(auVar30 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar30 >> 0x3f,0) << 7);
      }
      if ((uVar26 & 8) == 0) {
        if (local_1560 == 0) {
          uVar51 = 4;
        }
        else {
          uVar17 = uVar26 & 0xfffffffffffffff0;
          lVar27 = 0;
          for (uVar26 = local_1560; uVar18 = local_1560, (uVar26 & 1) == 0;
              uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          while( true ) {
            uVar18 = uVar18 - 1 & uVar18;
            uVar26 = *(ulong *)(uVar17 + lVar27 * 8);
            if (uVar18 == 0) break;
            *puVar22 = uVar26;
            puVar22 = puVar22 + 1;
            lVar27 = 0;
            for (uVar26 = uVar18; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              lVar27 = lVar27 + 1;
            }
          }
          uVar51 = 0;
        }
      }
      else {
        uVar51 = 6;
      }
    } while (uVar51 == 0);
    if (uVar51 == 6) {
      uVar17 = (ulong)((uint)uVar26 & 0xf);
      uVar51 = 0;
      uVar18 = uVar17 - 8;
      bVar28 = uVar17 != 8;
      if (bVar28) {
        uVar26 = uVar26 & 0xfffffffffffffff0;
        uVar17 = 0;
        do {
          lVar27 = uVar17 * 0x140;
          uVar19 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar31._4_4_ = uVar19;
          auVar31._0_4_ = uVar19;
          auVar31._8_4_ = uVar19;
          auVar31._12_4_ = uVar19;
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x90 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + lVar27));
          auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0xa0 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x10 + lVar27));
          auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0xb0 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + lVar27));
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0xc0 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x30 + lVar27));
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0xd0 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x40 + lVar27));
          auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0xe0 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x50 + lVar27));
          auVar67 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0xf0 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x60 + lVar27));
          auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x100 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x70 + lVar27));
          auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x110 + lVar27),auVar31,
                                    *(undefined1 (*) [16])(uVar26 + 0x80 + lVar27));
          auVar31 = vsubps_avx(auVar43,auVar30);
          auVar30 = vsubps_avx(auVar46,auVar39);
          auVar39 = vsubps_avx(auVar36,auVar61);
          auVar61 = vsubps_avx(auVar67,auVar43);
          auVar67 = vsubps_avx(auVar52,auVar46);
          auVar52 = vsubps_avx(auVar32,auVar36);
          auVar32._0_4_ = auVar30._0_4_ * auVar52._0_4_;
          auVar32._4_4_ = auVar30._4_4_ * auVar52._4_4_;
          auVar32._8_4_ = auVar30._8_4_ * auVar52._8_4_;
          auVar32._12_4_ = auVar30._12_4_ * auVar52._12_4_;
          local_1390 = vfmsub231ps_fma(auVar32,auVar67,auVar39);
          auVar35._0_4_ = auVar39._0_4_ * auVar61._0_4_;
          auVar35._4_4_ = auVar39._4_4_ * auVar61._4_4_;
          auVar35._8_4_ = auVar39._8_4_ * auVar61._8_4_;
          auVar35._12_4_ = auVar39._12_4_ * auVar61._12_4_;
          local_1380 = vfmsub231ps_fma(auVar35,auVar52,auVar31);
          uVar19 = *(undefined4 *)(ray + k * 4);
          auVar63._4_4_ = uVar19;
          auVar63._0_4_ = uVar19;
          auVar63._8_4_ = uVar19;
          auVar63._12_4_ = uVar19;
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar65._4_4_ = uVar19;
          auVar65._0_4_ = uVar19;
          auVar65._8_4_ = uVar19;
          auVar65._12_4_ = uVar19;
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar68._4_4_ = uVar19;
          auVar68._0_4_ = uVar19;
          auVar68._8_4_ = uVar19;
          auVar68._12_4_ = uVar19;
          fVar38 = *(float *)(ray + k * 4 + 0x80);
          auVar58._4_4_ = fVar38;
          auVar58._0_4_ = fVar38;
          auVar58._8_4_ = fVar38;
          auVar58._12_4_ = fVar38;
          auVar43 = vsubps_avx(auVar43,auVar63);
          fVar40 = *(float *)(ray + k * 4 + 0xa0);
          auVar64._4_4_ = fVar40;
          auVar64._0_4_ = fVar40;
          auVar64._8_4_ = fVar40;
          auVar64._12_4_ = fVar40;
          auVar46 = vsubps_avx(auVar46,auVar65);
          fVar41 = *(float *)(ray + k * 4 + 0xc0);
          auVar66._4_4_ = fVar41;
          auVar66._0_4_ = fVar41;
          auVar66._8_4_ = fVar41;
          auVar66._12_4_ = fVar41;
          auVar36 = vsubps_avx(auVar36,auVar68);
          auVar69._0_4_ = fVar38 * auVar46._0_4_;
          auVar69._4_4_ = fVar38 * auVar46._4_4_;
          auVar69._8_4_ = fVar38 * auVar46._8_4_;
          auVar69._12_4_ = fVar38 * auVar46._12_4_;
          auVar32 = vfmsub231ps_fma(auVar69,auVar43,auVar64);
          auVar60._0_4_ = auVar52._0_4_ * auVar32._0_4_;
          auVar60._4_4_ = auVar52._4_4_ * auVar32._4_4_;
          auVar60._8_4_ = auVar52._8_4_ * auVar32._8_4_;
          auVar60._12_4_ = auVar52._12_4_ * auVar32._12_4_;
          auVar70._0_4_ = auVar39._0_4_ * auVar32._0_4_;
          auVar70._4_4_ = auVar39._4_4_ * auVar32._4_4_;
          auVar70._8_4_ = auVar39._8_4_ * auVar32._8_4_;
          auVar70._12_4_ = auVar39._12_4_ * auVar32._12_4_;
          auVar52._0_4_ = fVar41 * auVar43._0_4_;
          auVar52._4_4_ = fVar41 * auVar43._4_4_;
          auVar52._8_4_ = fVar41 * auVar43._8_4_;
          auVar52._12_4_ = fVar41 * auVar43._12_4_;
          auVar52 = vfmsub231ps_fma(auVar52,auVar36,auVar58);
          auVar39 = vfmadd231ps_fma(auVar60,auVar52,auVar67);
          auVar52 = vfmadd231ps_fma(auVar70,auVar30,auVar52);
          auVar48._0_4_ = auVar31._0_4_ * auVar67._0_4_;
          auVar48._4_4_ = auVar31._4_4_ * auVar67._4_4_;
          auVar48._8_4_ = auVar31._8_4_ * auVar67._8_4_;
          auVar48._12_4_ = auVar31._12_4_ * auVar67._12_4_;
          local_1370 = vfmsub231ps_fma(auVar48,auVar61,auVar30);
          auVar30._0_4_ = fVar40 * auVar36._0_4_;
          auVar30._4_4_ = fVar40 * auVar36._4_4_;
          auVar30._8_4_ = fVar40 * auVar36._8_4_;
          auVar30._12_4_ = fVar40 * auVar36._12_4_;
          auVar32 = vfmsub231ps_fma(auVar30,auVar46,auVar66);
          auVar67._0_4_ = fVar41 * local_1370._0_4_;
          auVar67._4_4_ = fVar41 * local_1370._4_4_;
          auVar67._8_4_ = fVar41 * local_1370._8_4_;
          auVar67._12_4_ = fVar41 * local_1370._12_4_;
          auVar30 = vfmadd231ps_fma(auVar67,local_1380,auVar64);
          auVar67 = vfmadd231ps_fma(auVar30,local_1390,auVar58);
          auVar53._8_4_ = 0x80000000;
          auVar53._0_8_ = 0x8000000080000000;
          auVar53._12_4_ = 0x80000000;
          auVar39 = vfmadd231ps_fma(auVar39,auVar32,auVar61);
          auVar30 = vandps_avx(auVar67,auVar53);
          uVar51 = auVar30._0_4_;
          local_1420._0_4_ = (float)(uVar51 ^ auVar39._0_4_);
          uVar55 = auVar30._4_4_;
          local_1420._4_4_ = (float)(uVar55 ^ auVar39._4_4_);
          uVar56 = auVar30._8_4_;
          local_1420._8_4_ = (float)(uVar56 ^ auVar39._8_4_);
          uVar57 = auVar30._12_4_;
          local_1420._12_4_ = (float)(uVar57 ^ auVar39._12_4_);
          auVar30 = vfmadd231ps_fma(auVar52,auVar31,auVar32);
          local_1410._0_4_ = (float)(uVar51 ^ auVar30._0_4_);
          local_1410._4_4_ = (float)(uVar55 ^ auVar30._4_4_);
          local_1410._8_4_ = (float)(uVar56 ^ auVar30._8_4_);
          local_1410._12_4_ = (float)(uVar57 ^ auVar30._12_4_);
          auVar61 = ZEXT816(0) << 0x20;
          auVar30 = vcmpps_avx(local_1420,auVar61,5);
          auVar31 = vcmpps_avx(local_1410,auVar61,5);
          auVar30 = vandps_avx(auVar31,auVar30);
          auVar39._8_4_ = 0x7fffffff;
          auVar39._0_8_ = 0x7fffffff7fffffff;
          auVar39._12_4_ = 0x7fffffff;
          local_13f0 = vandps_avx(auVar67,auVar39);
          auVar31 = vcmpps_avx(auVar67,auVar61,4);
          auVar30 = vandps_avx(auVar30,auVar31);
          auVar61._0_4_ = local_1410._0_4_ + local_1420._0_4_;
          auVar61._4_4_ = local_1410._4_4_ + local_1420._4_4_;
          auVar61._8_4_ = local_1410._8_4_ + local_1420._8_4_;
          auVar61._12_4_ = local_1410._12_4_ + local_1420._12_4_;
          auVar31 = vcmpps_avx(auVar61,local_13f0,2);
          auVar39 = auVar31 & auVar30;
          if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar39[0xf] < '\0') {
            auVar30 = vandps_avx(auVar30,auVar31);
            auVar45._0_4_ = local_1370._0_4_ * auVar36._0_4_;
            auVar45._4_4_ = local_1370._4_4_ * auVar36._4_4_;
            auVar45._8_4_ = local_1370._8_4_ * auVar36._8_4_;
            auVar45._12_4_ = local_1370._12_4_ * auVar36._12_4_;
            auVar31 = vfmadd213ps_fma(auVar46,local_1380,auVar45);
            auVar31 = vfmadd213ps_fma(auVar43,local_1390,auVar31);
            local_1400._0_4_ = (float)(uVar51 ^ auVar31._0_4_);
            local_1400._4_4_ = (float)(uVar55 ^ auVar31._4_4_);
            local_1400._8_4_ = (float)(uVar56 ^ auVar31._8_4_);
            local_1400._12_4_ = (float)(uVar57 ^ auVar31._12_4_);
            fVar38 = *(float *)(ray + k * 4 + 0x60);
            auVar43._0_4_ = local_13f0._0_4_ * fVar38;
            auVar43._4_4_ = local_13f0._4_4_ * fVar38;
            auVar43._8_4_ = local_13f0._8_4_ * fVar38;
            auVar43._12_4_ = local_13f0._12_4_ * fVar38;
            auVar31 = vcmpps_avx(auVar43,local_1400,1);
            fVar38 = *(float *)(ray + k * 4 + 0x100);
            auVar46._0_4_ = local_13f0._0_4_ * fVar38;
            auVar46._4_4_ = local_13f0._4_4_ * fVar38;
            auVar46._8_4_ = local_13f0._8_4_ * fVar38;
            auVar46._12_4_ = local_13f0._12_4_ * fVar38;
            auVar39 = vcmpps_avx(local_1400,auVar46,2);
            auVar31 = vandps_avx(auVar31,auVar39);
            auVar39 = auVar30 & auVar31;
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar39[0xf] < '\0') {
              local_13d0 = vandps_avx(auVar30,auVar31);
              pSVar2 = context->scene;
              auVar30 = vrcpps_avx(local_13f0);
              auVar36._8_4_ = 0x3f800000;
              auVar36._0_8_ = &DAT_3f8000003f800000;
              auVar36._12_4_ = 0x3f800000;
              auVar31 = vfnmadd213ps_fma(local_13f0,auVar30,auVar36);
              auVar30 = vfmadd132ps_fma(auVar31,auVar30,auVar30);
              fVar38 = auVar30._0_4_;
              fVar40 = auVar30._4_4_;
              fVar41 = auVar30._8_4_;
              fVar42 = auVar30._12_4_;
              local_13a0[0] = fVar38 * local_1400._0_4_;
              local_13a0[1] = fVar40 * local_1400._4_4_;
              local_13a0[2] = fVar41 * local_1400._8_4_;
              local_13a0[3] = fVar42 * local_1400._12_4_;
              local_13c0[0] = fVar38 * local_1420._0_4_;
              local_13c0[1] = fVar40 * local_1420._4_4_;
              local_13c0[2] = fVar41 * local_1420._8_4_;
              local_13c0[3] = fVar42 * local_1420._12_4_;
              local_13b0._0_4_ = fVar38 * local_1410._0_4_;
              local_13b0._4_4_ = fVar40 * local_1410._4_4_;
              local_13b0._8_4_ = fVar41 * local_1410._8_4_;
              local_13b0._12_4_ = fVar42 * local_1410._12_4_;
              uVar19 = vmovmskps_avx(local_13d0);
              local_15d0 = CONCAT44((int)((ulong)pSVar2 >> 0x20),uVar19);
              do {
                uVar7 = 0;
                for (uVar20 = local_15d0; (uVar20 & 1) == 0;
                    uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  uVar7 = uVar7 + 1;
                }
                uVar51 = *(uint *)(lVar27 + uVar26 + 0x120 + uVar7 * 4);
                pGVar3 = (pSVar2->geometries).items[uVar51].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  local_15d0 = local_15d0 ^ 1L << (uVar7 & 0x3f);
                  bVar29 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar29 = false;
                }
                else {
                  local_1360 = auVar71._0_32_;
                  uVar20 = (ulong)(uint)((int)uVar7 * 4);
                  uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar1 = *(undefined4 *)((long)local_13c0 + uVar20);
                  local_12c0._4_4_ = uVar1;
                  local_12c0._0_4_ = uVar1;
                  local_12c0._8_4_ = uVar1;
                  local_12c0._12_4_ = uVar1;
                  local_12c0._16_4_ = uVar1;
                  local_12c0._20_4_ = uVar1;
                  local_12c0._24_4_ = uVar1;
                  local_12c0._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_13b0 + uVar20);
                  local_12a0._4_4_ = uVar1;
                  local_12a0._0_4_ = uVar1;
                  local_12a0._8_4_ = uVar1;
                  local_12a0._12_4_ = uVar1;
                  local_12a0._16_4_ = uVar1;
                  local_12a0._20_4_ = uVar1;
                  local_12a0._24_4_ = uVar1;
                  local_12a0._28_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_13a0 + uVar20);
                  local_1550.context = context->user;
                  uVar1 = *(undefined4 *)(lVar27 + uVar26 + 0x130 + uVar20);
                  local_1280._4_4_ = uVar1;
                  local_1280._0_4_ = uVar1;
                  local_1280._8_4_ = uVar1;
                  local_1280._12_4_ = uVar1;
                  local_1280._16_4_ = uVar1;
                  local_1280._20_4_ = uVar1;
                  local_1280._24_4_ = uVar1;
                  local_1280._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_1390 + uVar20);
                  local_1300 = *(undefined4 *)(local_1380 + uVar20);
                  local_12e0 = *(undefined4 *)(local_1370 + uVar20);
                  local_1260._4_4_ = uVar51;
                  local_1260._0_4_ = uVar51;
                  local_1260._8_4_ = uVar51;
                  local_1260._12_4_ = uVar51;
                  local_1260._16_4_ = uVar51;
                  local_1260._20_4_ = uVar51;
                  local_1260._24_4_ = uVar51;
                  local_1260._28_4_ = uVar51;
                  local_1320[0] = (RTCHitN)(char)uVar1;
                  local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[4] = (RTCHitN)(char)uVar1;
                  local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[8] = (RTCHitN)(char)uVar1;
                  local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0xc] = (RTCHitN)(char)uVar1;
                  local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x10] = (RTCHitN)(char)uVar1;
                  local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x14] = (RTCHitN)(char)uVar1;
                  local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x18] = (RTCHitN)(char)uVar1;
                  local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x1c] = (RTCHitN)(char)uVar1;
                  local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_12fc = local_1300;
                  uStack_12f8 = local_1300;
                  uStack_12f4 = local_1300;
                  uStack_12f0 = local_1300;
                  uStack_12ec = local_1300;
                  uStack_12e8 = local_1300;
                  uStack_12e4 = local_1300;
                  uStack_12dc = local_12e0;
                  uStack_12d8 = local_12e0;
                  uStack_12d4 = local_12e0;
                  uStack_12d0 = local_12e0;
                  uStack_12cc = local_12e0;
                  uStack_12c8 = local_12e0;
                  uStack_12c4 = local_12e0;
                  vpcmpeqd_avx2(local_12c0,local_12c0);
                  uStack_123c = (local_1550.context)->instID[0];
                  local_1240 = uStack_123c;
                  uStack_1238 = uStack_123c;
                  uStack_1234 = uStack_123c;
                  uStack_1230 = uStack_123c;
                  uStack_122c = uStack_123c;
                  uStack_1228 = uStack_123c;
                  uStack_1224 = uStack_123c;
                  uStack_121c = (local_1550.context)->instPrimID[0];
                  local_1220 = uStack_121c;
                  uStack_1218 = uStack_121c;
                  uStack_1214 = uStack_121c;
                  uStack_1210 = uStack_121c;
                  uStack_120c = uStack_121c;
                  uStack_1208 = uStack_121c;
                  uStack_1204 = uStack_121c;
                  local_1440 = local_1340._0_8_;
                  uStack_1438 = local_1340._8_8_;
                  uStack_1430 = local_1340._16_8_;
                  uStack_1428 = local_1340._24_8_;
                  local_1550.valid = (int *)&local_1440;
                  local_1550.geometryUserPtr = pGVar3->userPtr;
                  local_1550.hit = local_1320;
                  local_1550.N = 8;
                  local_1550.ray = (RTCRayN *)ray;
                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar3->occlusionFilterN)(&local_1550);
                  }
                  auVar6._8_8_ = uStack_1438;
                  auVar6._0_8_ = local_1440;
                  auVar6._16_8_ = uStack_1430;
                  auVar6._24_8_ = uStack_1428;
                  auVar6 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6);
                  auVar33 = _DAT_0205a980 & ~auVar6;
                  if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar33 >> 0x7f,0) == '\0') &&
                        (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar33 >> 0xbf,0) == '\0') &&
                      (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar33[0x1f]) {
                    auVar6 = auVar6 ^ _DAT_0205a980;
                  }
                  else {
                    p_Var4 = context->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var4)(&local_1550);
                    }
                    auVar5._8_8_ = uStack_1438;
                    auVar5._0_8_ = local_1440;
                    auVar5._16_8_ = uStack_1430;
                    auVar5._24_8_ = uStack_1428;
                    auVar33 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar5);
                    auVar6 = auVar33 ^ _DAT_0205a980;
                    auVar37._8_4_ = 0xff800000;
                    auVar37._0_8_ = 0xff800000ff800000;
                    auVar37._12_4_ = 0xff800000;
                    auVar37._16_4_ = 0xff800000;
                    auVar37._20_4_ = 0xff800000;
                    auVar37._24_4_ = 0xff800000;
                    auVar37._28_4_ = 0xff800000;
                    auVar33 = vblendvps_avx(auVar37,*(undefined1 (*) [32])(local_1550.ray + 0x100),
                                            auVar33);
                    *(undefined1 (*) [32])(local_1550.ray + 0x100) = auVar33;
                  }
                  bVar14 = (auVar6 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar15 = (auVar6 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar13 = (auVar6 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar12 = SUB321(auVar6 >> 0x7f,0) == '\0';
                  bVar11 = (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar10 = SUB321(auVar6 >> 0xbf,0) == '\0';
                  bVar9 = (auVar6 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar8 = -1 < auVar6[0x1f];
                  bVar29 = ((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) &&
                           bVar9) && bVar8;
                  if (((((((bVar14 && bVar15) && bVar13) && bVar12) && bVar11) && bVar10) && bVar9)
                      && bVar8) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar19;
                    local_15d0 = local_15d0 ^ 1L << (uVar7 & 0x3f);
                  }
                  auVar71 = ZEXT3264(local_1360);
                }
                uVar51 = 0;
                auVar47 = ZEXT3264(local_1480);
                auVar44 = ZEXT3264(local_1460);
                auVar62 = ZEXT3264(local_1520);
                auVar59 = ZEXT3264(local_1500);
                auVar54 = ZEXT3264(local_14e0);
                auVar50 = ZEXT3264(local_14c0);
                auVar49 = ZEXT3264(local_14a0);
                if (!bVar29) {
                  if (bVar28) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar51 = 1;
                  }
                  goto LAB_006b9418;
                }
              } while (local_15d0 != 0);
            }
          }
          uVar51 = 0;
          uVar17 = uVar17 + 1;
          bVar28 = uVar17 < uVar18;
        } while (uVar17 != uVar18);
        auVar44 = ZEXT3264(local_1460);
        auVar47 = ZEXT3264(local_1480);
        auVar49 = ZEXT3264(local_14a0);
        auVar50 = ZEXT3264(local_14c0);
        auVar54 = ZEXT3264(local_14e0);
        auVar59 = ZEXT3264(local_1500);
        auVar62 = ZEXT3264(local_1520);
      }
    }
LAB_006b9418:
  } while ((uVar51 & 3) == 0);
  return puVar21 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }